

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivTransform(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  bool bVar2;
  int local_54;
  Gia_Obj_t *pGStack_50;
  int i;
  Gia_Obj_t *pObj;
  int nTotalClas;
  int nTotalLits;
  int nRemovedClas;
  int nRemovedLits;
  int k;
  int Ent;
  int iNode;
  int iRepr;
  Vec_Int_t *vClassNew;
  Vec_Int_t *vClass;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  nTotalLits = 0;
  nTotalClas = 0;
  pObj._4_4_ = 0;
  pObj._0_4_ = 0;
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x5bb,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
  }
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  local_54 = 0;
  while( true ) {
    bVar2 = false;
    if (local_54 < p->nObjs) {
      pGStack_50 = Gia_ManObj(p,local_54);
      bVar2 = pGStack_50 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsCi(pGStack_50);
    if (((iVar1 != 0) || (iVar1 = Gia_ObjIsAnd(pGStack_50), iVar1 != 0)) &&
       (iVar1 = Gia_ObjColors(p,local_54), iVar1 == 0)) {
      __assert_fail("Gia_ObjColors(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x5c0,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
    }
    local_54 = local_54 + 1;
  }
  Ent = Gia_ManObjNum(p);
  while( true ) {
    do {
      Ent = Ent + -1;
      if (Ent < 1) {
        Vec_IntFree(p_00);
        Vec_IntFree(p_01);
        if (fVerbose != 0) {
          Abc_Print(1,"Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n",
                    (ulong)(uint)nTotalClas,(ulong)(uint)pObj,(ulong)(uint)nTotalLits,
                    (ulong)pObj._4_4_);
        }
        return;
      }
      iVar1 = Gia_ObjIsHead(p,Ent);
    } while (iVar1 == 0);
    pObj._0_4_ = (uint)pObj + 1;
    Vec_IntClear(p_00);
    Vec_IntClear(p_01);
    iVar1 = Gia_ObjIsHead(p,Ent);
    if (iVar1 == 0) break;
    for (k = Ent; 0 < k; k = Gia_ObjNext(p,k)) {
      pObj._4_4_ = pObj._4_4_ + 1;
      Vec_IntPush(p_00,k);
      iVar1 = Gia_ObjColors(p,k);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjColors(p, iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x5ca,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
      }
      iVar1 = Gia_ObjColors(p,k);
      if (iVar1 == 3) {
        nTotalLits = nTotalLits + 1;
      }
      else {
        Vec_IntPush(p_01,k);
      }
    }
    for (nRemovedClas = 0; iVar1 = Vec_IntSize(p_00), nRemovedClas < iVar1;
        nRemovedClas = nRemovedClas + 1) {
      iVar1 = Vec_IntEntry(p_00,nRemovedClas);
      p->pReprs[iVar1] = (Gia_Rpr_t)((uint)p->pReprs[iVar1] & 0xefffffff);
      p->pReprs[iVar1] = (Gia_Rpr_t)((uint)p->pReprs[iVar1] & 0xdfffffff);
      p->pReprs[iVar1] = (Gia_Rpr_t)((uint)p->pReprs[iVar1] & 0xf0000000 | 0xfffffff);
      p->pNexts[iVar1] = 0;
    }
    iVar1 = Vec_IntSize(p_01);
    if (iVar1 < 2) {
      nTotalClas = nTotalClas + 1;
    }
    else {
      Cec_ManSimClassCreate(p,p_01);
    }
  }
  __assert_fail("Gia_ObjIsHead(p, iRepr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x5c6,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManEquivTransform( Gia_Man_t * p, int fVerbose )
{
    extern void Cec_ManSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass );
    Vec_Int_t * vClass, * vClassNew;
    int iRepr, iNode, Ent, k;
    int nRemovedLits = 0, nRemovedClas = 0;
    int nTotalLits = 0, nTotalClas = 0;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts );
    vClass = Vec_IntAlloc( 100 );
    vClassNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
            assert( Gia_ObjColors(p, i) );
    Gia_ManForEachClassReverse( p, iRepr )
    {
        nTotalClas++;
        Vec_IntClear( vClass );
        Vec_IntClear( vClassNew );
        Gia_ClassForEachObj( p, iRepr, iNode )
        {
            nTotalLits++;
            Vec_IntPush( vClass, iNode );
            assert( Gia_ObjColors(p, iNode) );
            if ( Gia_ObjColors(p, iNode) != 3 )
                Vec_IntPush( vClassNew, iNode );
            else
                nRemovedLits++;
        }
        Vec_IntForEachEntry( vClass, Ent, k )
        {
            p->pReprs[Ent].fFailed = p->pReprs[Ent].fProved = 0;
            p->pReprs[Ent].iRepr = GIA_VOID;
            p->pNexts[Ent] = 0;
        }
        if ( Vec_IntSize(vClassNew) < 2 )
        {
            nRemovedClas++;
            continue;
        }
        Cec_ManSimClassCreate( p, vClassNew );
    }
    Vec_IntFree( vClass );
    Vec_IntFree( vClassNew );
    if ( fVerbose )
    Abc_Print( 1, "Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n",
        nRemovedClas, nTotalClas, nRemovedLits, nTotalLits );
}